

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::loadScene(Application *this,char *filename)

{
  int iVar1;
  ostream *poVar2;
  void *__s;
  char *in_RSI;
  long in_RDI;
  SceneInfo *sceneInfo;
  Camera originalCanonicalCamera;
  Camera originalCamera;
  SceneInfo *in_stack_00000560;
  char *in_stack_00000568;
  Camera *in_stack_fffffffffffffe08;
  Camera *in_stack_fffffffffffffe10;
  undefined1 local_1d0 [224];
  undefined1 local_f0 [224];
  char *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<((ostream *)&std::cerr,"Loading scene from file ");
  poVar2 = std::operator<<(poVar2,local_10);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Camera::Camera(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Camera::Camera(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  __s = operator_new(0x18);
  memset(__s,0,0x18);
  Collada::SceneInfo::SceneInfo((SceneInfo *)0x24c94a);
  iVar1 = Collada::ColladaParser::load(in_stack_00000568,in_stack_00000560);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: scene file failed to load.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (__s != (void *)0x0) {
      Collada::SceneInfo::~SceneInfo((SceneInfo *)0x24c9a7);
      operator_delete(__s);
    }
  }
  else {
    load((Application *)originalCamera.maxR,(SceneInfo *)originalCamera.minR);
    loadSkeleton((Application *)originalCamera.vFov,(char *)originalCamera.hFov,
                 (Scene *)originalCanonicalCamera.screenDist);
    memcpy((void *)(in_RDI + 0x58),local_f0,0xe0);
    memcpy((void *)(in_RDI + 0x138),local_1d0,0xe0);
  }
  return;
}

Assistant:

void Application::loadScene(const char *filename) {
  cerr << "Loading scene from file " << filename << endl;

  Camera originalCamera = camera;
  Camera originalCanonicalCamera = canonicalCamera;

  Collada::SceneInfo *sceneInfo = new Collada::SceneInfo();
  if (Collada::ColladaParser::load(filename, sceneInfo) < 0) {
    cerr << "Warning: scene file failed to load." << endl;
    delete sceneInfo;
    return;
  }
  load(sceneInfo);
  loadSkeleton(filename, scene);

  camera = originalCamera;
  canonicalCamera = originalCanonicalCamera;
}